

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O3

DWORD __thiscall
FNodeBuilder::PushGLSeg
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          FPrivSeg *seg,vertex_t *outVerts)

{
  sector_t_conflict **ppsVar1;
  int iVar2;
  int iVar3;
  DWORD DVar4;
  uint uVar5;
  glseg_t *pgVar6;
  sector_t_conflict *psVar7;
  sector_t_conflict *psVar8;
  line_t_conflict *plVar9;
  side_t *psVar10;
  
  iVar2 = seg->v1;
  iVar3 = seg->v2;
  psVar7 = seg->frontsector;
  psVar8 = seg->backsector;
  if ((long)seg->linedef == -1) {
    psVar10 = (side_t *)0x0;
    plVar9 = (line_t_conflict *)0x0;
  }
  else {
    plVar9 = this->Level->Lines + seg->linedef;
    psVar10 = this->Level->Sides + seg->sidedef;
  }
  DVar4 = seg->partner;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Grow(segs,1);
  pgVar6 = segs->Array;
  uVar5 = segs->Count;
  pgVar6[uVar5].super_seg_t.v1 = outVerts + iVar2;
  pgVar6[uVar5].super_seg_t.v2 = outVerts + iVar3;
  pgVar6[uVar5].super_seg_t.sidedef = psVar10;
  pgVar6[uVar5].super_seg_t.linedef = plVar9;
  ppsVar1 = &pgVar6[uVar5].super_seg_t.frontsector;
  *ppsVar1 = psVar7;
  ppsVar1[1] = psVar8;
  pgVar6[uVar5].Partner = DVar4;
  DVar4 = segs->Count;
  segs->Count = DVar4 + 1;
  return DVar4;
}

Assistant:

DWORD FNodeBuilder::PushGLSeg (TArray<glseg_t> &segs, const FPrivSeg *seg, vertex_t *outVerts)
{
	glseg_t newseg;

	newseg.v1 = outVerts + seg->v1;
	newseg.v2 = outVerts + seg->v2;
	newseg.backsector = seg->backsector;
	newseg.frontsector = seg->frontsector;
	if (seg->linedef != -1)
	{
		newseg.linedef = Level.Lines + seg->linedef;
		newseg.sidedef = Level.Sides + seg->sidedef;
	}
	else
	{
		newseg.linedef = NULL;
		newseg.sidedef = NULL;
	}
	newseg.Partner = seg->partner;
	return (DWORD)segs.Push (newseg);
}